

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::ipc::ClientImpl::~ClientImpl(ClientImpl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  UnixSocket *this_01;
  UnixSocket *in_RSI;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__ClientImpl_003a3ad8;
  (this->super_EventListener)._vptr_EventListener = (_func_int **)&PTR__ClientImpl_003a3b28;
  OnDisconnect(this,in_RSI);
  *(this->weak_ptr_factory_).weak_ptr_.handle_.
   super___shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type)0x0;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::__cxx11::
  _List_base<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>,_std::allocator<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>
  ::_M_clear(&(this->queued_bindings_).
              super__List_base<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>,_std::allocator<perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>
            );
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>,_std::_Select1st<std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::base::WeakPtr<perfetto::ipc::ServiceProxy>_>_>_>
  ::~_Rb_tree(&(this->service_bindings_)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>,_std::_Select1st<std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::ipc::ClientImpl::QueuedRequest>_>_>
  ::~_Rb_tree(&(this->queued_requests_)._M_t);
  base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&this->received_fd_,-1);
  BufferedFrameDeserializer::~BufferedFrameDeserializer(&this->frame_deserializer_);
  this_01 = (this->sock_)._M_t.
            super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
            ._M_t.
            super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
            .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
  if (this_01 != (UnixSocket *)0x0) {
    base::UnixSocket::~UnixSocket(this_01);
    operator_delete(this_01,0x40);
  }
  (this->sock_)._M_t.
  super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
  .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl = (UnixSocket *)0x0;
  return;
}

Assistant:

ClientImpl::~ClientImpl() {
  // Ensure we are not destroyed in the middle of invoking a reply.
  PERFETTO_DCHECK(!invoking_method_reply_);
  OnDisconnect(
      nullptr);  // The base::UnixSocket* ptr is not used in OnDisconnect().
}